

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

int CVmObjBigNum::is_frac_zero(char *ext)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  char *in_RDI;
  size_t prec;
  int exp;
  size_t idx;
  ulong local_30;
  ulong local_18;
  
  iVar1 = get_exp((char *)0x2c21b3);
  sVar3 = get_prec((char *)0x2c21c1);
  if (iVar1 < 1) {
    local_30 = 0;
  }
  else {
    local_30 = (ulong)iVar1;
  }
  local_18 = local_30;
  while( true ) {
    if (sVar3 <= local_18) {
      return 1;
    }
    uVar2 = get_dig(in_RDI,local_18);
    if (uVar2 != 0) break;
    local_18 = local_18 + 1;
  }
  return 0;
}

Assistant:

int CVmObjBigNum::is_frac_zero(const char *ext)
{
    size_t idx;
    int exp = get_exp(ext);
    size_t prec = get_prec(ext);

    /* start at the first fractional digit, if represented */
    idx = (exp <= 0 ? 0 : (size_t)exp);

    /* scan the digits for a non-zero digit */
    for ( ; idx < prec ; ++idx)
    {
        /* if this digit is non-zero, the fraction is non-zero */
        if (get_dig(ext, idx) != 0)
            return FALSE;
    }

    /* we didn't find any non-zero fractional digits */
    return TRUE;
}